

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNATrie.cpp
# Opt level: O1

long __thiscall DNANode::find(DNANode *this,Base *dna,size_t size)

{
  size_t sVar1;
  
  sVar1 = 0;
  while( true ) {
    if (size == sVar1) {
      return this->count;
    }
    this = this->childNodes[dna[sVar1]];
    if (this == (DNANode *)0x0) break;
    sVar1 = sVar1 + 1;
  }
  return -1;
}

Assistant:

long DNANode::find(const DNA::Base* dna, size_t size)
{
    if (!size)
        return count;
    DNANode* nextNode = childNodes[*dna];
    if (nextNode == nullptr)
        return -1;
    else
        return nextNode->find(dna + 1, size - 1);
}